

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::alloc_line_pages(CTcCodeStream *this,size_t number_to_add)

{
  void *pvVar1;
  size_t __size;
  long in_RSI;
  long in_RDI;
  size_t i;
  size_t siz;
  undefined8 local_20;
  
  __size = (*(long *)(in_RDI + 0xb8) + in_RSI) * 8;
  if (*(long *)(in_RDI + 0xb0) == 0) {
    pvVar1 = malloc(__size);
    *(void **)(in_RDI + 0xb0) = pvVar1;
  }
  else {
    pvVar1 = realloc(*(void **)(in_RDI + 0xb0),__size);
    *(void **)(in_RDI + 0xb0) = pvVar1;
  }
  for (local_20 = *(ulong *)(in_RDI + 0xb8); local_20 < (ulong)(*(long *)(in_RDI + 0xb8) + in_RSI);
      local_20 = local_20 + 1) {
    pvVar1 = malloc(0x6000);
    *(void **)(*(long *)(in_RDI + 0xb0) + local_20 * 8) = pvVar1;
  }
  *(long *)(in_RDI + 0xb8) = in_RSI + *(long *)(in_RDI + 0xb8);
  return;
}

Assistant:

void CTcCodeStream::alloc_line_pages(size_t number_to_add)
{
    size_t siz;
    size_t i;

    /* create or expand the master page array */
    siz = (line_pages_alloc_ + number_to_add) * sizeof(tcgen_line_page_t *);
    if (line_pages_ == 0)
        line_pages_ = (tcgen_line_page_t **)t3malloc(siz);
    else
        line_pages_ = (tcgen_line_page_t **)t3realloc(line_pages_, siz);

    /* allocate the new pages */
    for (i = line_pages_alloc_ ; i < line_pages_alloc_ + number_to_add ; ++i)
    {
        /* allocate this page */
        line_pages_[i] = (tcgen_line_page_t *)
                         t3malloc(sizeof(tcgen_line_page_t));
    }

    /* remember the new allocation */
    line_pages_alloc_ += number_to_add;
}